

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::solve_equality
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this)

{
  uint uVar1;
  pointer piVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  float *pfVar6;
  pointer piVar7;
  pointer pnVar8;
  ptrdiff_t _Num;
  long lVar9;
  ulong uVar10;
  float fVar11;
  
  piVar7 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->lower_bound = INFINITY;
  lVar9 = (long)piVar2 - (long)piVar7;
  if (lVar9 == 0) {
    fVar11 = 0.0;
  }
  else {
    fVar11 = 0.0;
    lVar9 = (lVar9 >> 3) * -0x5555555555555555;
    do {
      pfVar6 = &piVar7->r;
      piVar7 = piVar7 + 1;
      lVar9 = lVar9 + -1;
      uVar4 = vcmpss_avx512f(ZEXT416((uint)*pfVar6),ZEXT816(0) << 0x40,1);
      bVar5 = (bool)((byte)uVar4 & 1);
      fVar11 = (float)((uint)bVar5 * (int)(fVar11 + *pfVar6) + (uint)!bVar5 * (int)fVar11);
    } while (lVar9 != 0);
  }
  this->upper_bound = fVar11;
  make_init_node_0(this);
  pnVar8 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pnVar8[-1].sumfactor == this->b_min) {
    this->upper_bound = pnVar8[-1].sumr;
    uVar10 = (ulong)(this->subvector).m_element_size;
    if (uVar10 != 0) {
      pcVar3 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar3 + this->solution,pcVar3 + pnVar8[-1].variables,uVar10);
      pnVar8 = (this->nodes).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    uVar1 = pnVar8[-1].variables;
    shared_subvector::check_index(&this->subvector,uVar1);
    *(size_type *)
     ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
      _M_impl.super__Vector_impl_data._M_start + uVar1) = (this->subvector).m_free_list_head;
    (this->subvector).m_free_list_head = uVar1;
  }
  else {
    make_init_node_1(this);
    pnVar8 = (this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pnVar8[-1].sumfactor == this->b_min) {
      this->upper_bound = pnVar8[-1].sumr;
      uVar10 = (ulong)(this->subvector).m_element_size;
      if (uVar10 != 0) {
        pcVar3 = (this->subvector).m_container.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memmove(pcVar3 + this->solution,pcVar3 + pnVar8[-1].variables,uVar10);
        pnVar8 = (this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar1 = pnVar8[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar1);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar1) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar1;
      pnVar8 = (this->nodes).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->nodes).
      super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
      ._M_impl.super__Vector_impl_data._M_finish = pnVar8;
    }
    if ((this->nodes).
        super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
        ._M_impl.super__Vector_impl_data._M_start != pnVar8) {
      do {
        make_next_equality_node(this);
      } while ((this->nodes).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (this->nodes).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void solve_equality()
    {
        lower_bound = compute_lower_bound();
        upper_bound = compute_upper_bound();

        make_init_node_0();
        if (nodes.back().sumfactor == b_min) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
            subvector.remove(nodes.back().variables);
            return;
        }

        make_init_node_1();
        if (nodes.back().sumfactor == b_min) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        while (!nodes.empty())
            make_next_equality_node();
    }